

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O3

Float __thiscall pbrt::Vertex::PDF(Vertex *this,Integrator *integrator,Vertex *prev,Vertex *next)

{
  undefined8 uVar1;
  VertexType VVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Float FVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  Vector3f woRender;
  Vector3f wiRender;
  Float pdf;
  Float unused;
  Float local_9c;
  Tuple3<pbrt::Vector3,_float> local_98;
  Float local_8c;
  RayDifferential local_88;
  
  VVar2 = this->type;
  if (VVar2 == Light) {
    FVar6 = PdfLight(this,integrator,next);
    return FVar6;
  }
  uVar1 = *(undefined8 *)
           &(this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  auVar8 = vinsertps_avx(*(undefined1 (*) [16])&next->field_2,
                         ZEXT416((uint)(next->field_2).ei.super_Interaction.pi.
                                       super_Point3<pbrt::Interval<float>_>.
                                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high),
                         0x10);
  auVar5 = vinsertps_avx(*(undefined1 (*) [16])&this->field_2,
                         ZEXT416((uint)(this->field_2).ei.super_Interaction.pi.
                                       super_Point3<pbrt::Interval<float>_>.
                                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high),
                         0x10);
  auVar11._0_4_ = ((float)uVar1 + auVar5._0_4_) * 0.5;
  auVar11._4_4_ = ((float)((ulong)uVar1 >> 0x20) + auVar5._4_4_) * 0.5;
  auVar11._8_4_ = (auVar5._8_4_ + 0.0) * 0.5;
  auVar11._12_4_ = (auVar5._12_4_ + 0.0) * 0.5;
  fVar3 = ((this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
          (this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5;
  uVar1 = *(undefined8 *)
           &(next->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  fVar14 = ((next->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
           (next->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5 - fVar3;
  auVar5._0_4_ = ((float)uVar1 + auVar8._0_4_) * 0.5;
  auVar5._4_4_ = ((float)((ulong)uVar1 >> 0x20) + auVar8._4_4_) * 0.5;
  auVar5._8_4_ = (auVar8._8_4_ + 0.0) * 0.5;
  auVar5._12_4_ = (auVar8._12_4_ + 0.0) * 0.5;
  auVar5 = vsubps_avx(auVar5,auVar11);
  auVar8._0_4_ = auVar5._0_4_ * auVar5._0_4_;
  auVar8._4_4_ = auVar5._4_4_ * auVar5._4_4_;
  auVar8._8_4_ = auVar5._8_4_ * auVar5._8_4_;
  auVar8._12_4_ = auVar5._12_4_ * auVar5._12_4_;
  auVar8 = vmovshdup_avx(auVar8);
  auVar8 = vfmadd231ss_fma(auVar8,auVar5,auVar5);
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar14),ZEXT416((uint)fVar14));
  if ((auVar8._0_4_ == 0.0) && (!NAN(auVar8._0_4_))) {
    return 0.0;
  }
  auVar8 = vsqrtss_avx(auVar8,auVar8);
  fVar7 = auVar8._0_4_;
  auVar15._4_4_ = fVar7;
  auVar15._0_4_ = fVar7;
  auVar15._8_4_ = fVar7;
  auVar15._12_4_ = fVar7;
  auVar12._0_4_ = fVar14 / fVar7;
  auVar12._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar8 = vdivps_avx(auVar5,auVar15);
  local_98._0_8_ = vmovlps_avx(auVar8);
  local_98.z = auVar12._0_4_;
  if (prev == (Vertex *)0x0) {
    if (VVar2 != Camera) {
      LogFatal<char_const(&)[27]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp"
                 ,0x6e0,"Check failed: %s",(char (*) [27])"type == VertexType::Camera");
    }
  }
  else {
    uVar1 = *(undefined8 *)
             &(prev->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
    auVar5 = vinsertps_avx(ZEXT416((uint)(prev->field_2).ei.super_Interaction.pi.
                                         super_Point3<pbrt::Interval<float>_>.
                                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low),
                           ZEXT416((uint)(prev->field_2).ei.super_Interaction.pi.
                                         super_Point3<pbrt::Interval<float>_>.
                                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high),
                           0x10);
    auVar16._0_4_ = (float)uVar1 + auVar5._0_4_;
    auVar16._4_4_ = (float)((ulong)uVar1 >> 0x20) + auVar5._4_4_;
    auVar16._8_4_ = auVar5._8_4_ + 0.0;
    auVar16._12_4_ = auVar5._12_4_ + 0.0;
    auVar4._8_4_ = 0x3f000000;
    auVar4._0_8_ = 0x3f0000003f000000;
    auVar4._12_4_ = 0x3f000000;
    auVar5 = vmulps_avx512vl(auVar16,auVar4);
    fVar3 = ((prev->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
            (prev->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5 - fVar3;
    auVar11 = vsubps_avx(auVar5,auVar11);
    auVar9._0_4_ = auVar11._0_4_ * auVar11._0_4_;
    auVar9._4_4_ = auVar11._4_4_ * auVar11._4_4_;
    auVar9._8_4_ = auVar11._8_4_ * auVar11._8_4_;
    auVar9._12_4_ = auVar11._12_4_ * auVar11._12_4_;
    auVar5 = vmovshdup_avx(auVar9);
    auVar5 = vfmadd231ss_fma(auVar5,auVar11,auVar11);
    auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)fVar3),ZEXT416((uint)fVar3));
    if ((auVar5._0_4_ == 0.0) && (!NAN(auVar5._0_4_))) {
      return 0.0;
    }
    auVar5 = vsqrtss_avx(auVar5,auVar5);
    local_9c = 0.0;
    fVar14 = auVar5._0_4_;
    auVar10._4_4_ = fVar14;
    auVar10._0_4_ = fVar14;
    auVar10._8_4_ = fVar14;
    auVar10._12_4_ = fVar14;
    auVar5 = vdivps_avx(auVar11,auVar10);
    woRender.super_Tuple3<pbrt::Vector3,_float>.z = fVar3 / fVar14;
    if (VVar2 == Medium) {
      auVar13._0_4_ = auVar5._0_4_ * auVar8._0_4_;
      auVar13._4_4_ = auVar5._4_4_ * auVar8._4_4_;
      auVar13._8_4_ = auVar5._8_4_ * auVar8._8_4_;
      auVar13._12_4_ = auVar5._12_4_ * auVar8._12_4_;
      auVar11 = vmovshdup_avx(auVar13);
      auVar8 = vfmadd231ss_fma(auVar11,auVar5,auVar8);
      fVar3 = *(float *)((ulong)(this->field_2).ei.field_0 & 0xffffffffffff);
      auVar8 = vfmadd213ss_fma(auVar12,ZEXT416((uint)woRender.super_Tuple3<pbrt::Vector3,_float>.z),
                               auVar8);
      auVar5 = vfmadd213ss_fma(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),
                               SUB6416(ZEXT464(0x3f800000),0));
      auVar11 = vfnmadd213ss_fma(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),
                                 SUB6416(ZEXT464(0x3f800000),0));
      auVar5 = vfmadd213ss_fma(ZEXT416((uint)(fVar3 + fVar3)),auVar8,auVar5);
      auVar8 = vmaxss_avx(auVar5,ZEXT816(0));
      auVar8 = vsqrtss_avx(auVar8,auVar8);
      local_9c = (auVar11._0_4_ * 0.07957747) / (auVar5._0_4_ * auVar8._0_4_);
      goto LAB_0044e97e;
    }
    if (VVar2 == Surface) {
      woRender.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar5._0_8_;
      wiRender.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar8._0_8_;
      wiRender.super_Tuple3<pbrt::Vector3,_float>.z = auVar12._0_4_;
      local_9c = BSDF::PDF(&this->bsdf,woRender,wiRender,Radiance,All);
      goto LAB_0044e97e;
    }
    if (VVar2 != Camera) {
      LogFatal(Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp"
               ,0x6eb,"Vertex::PDF(): Unimplemented");
    }
  }
  local_9c = 0.0;
  Interaction::SpawnRay(&local_88,&(this->field_2).ei.super_Interaction,(Vector3f *)&local_98);
  CameraHandle::PDF_We
            ((CameraHandle *)&(this->field_2).mi.phase,&local_88.super_Ray,&local_8c,&local_9c);
LAB_0044e97e:
  FVar6 = ConvertDensity(this,local_9c,next);
  return FVar6;
}

Assistant:

Float PDF(const Integrator &integrator, const Vertex *prev,
              const Vertex &next) const {
        if (type == VertexType::Light)
            return PdfLight(integrator, next);
        // Compute directions to preceding and next vertex
        Vector3f wn = next.p() - p();
        if (LengthSquared(wn) == 0)
            return 0;
        wn = Normalize(wn);
        Vector3f wp;
        if (prev) {
            wp = prev->p() - p();
            if (LengthSquared(wp) == 0)
                return 0;
            wp = Normalize(wp);
        } else
            CHECK(type == VertexType::Camera);

        // Compute directional density depending on the vertex type
        Float pdf = 0, unused;
        if (type == VertexType::Camera)
            ei.camera.PDF_We(ei.SpawnRay(wn), &unused, &pdf);
        else if (type == VertexType::Surface)
            pdf = bsdf.PDF(wp, wn);
        else if (type == VertexType::Medium)
            pdf = mi.phase.p(wp, wn);
        else
            LOG_FATAL("Vertex::PDF(): Unimplemented");

        // Return probability per unit area at vertex _next_
        return ConvertDensity(pdf, next);
    }